

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lev_main.c
# Opt level: O0

int get_monster_id(char *s,char c)

{
  int iVar1;
  int local_28;
  int local_20;
  int class;
  int i;
  char c_local;
  char *s_local;
  
  if (c == '\0') {
    local_28 = 0;
  }
  else {
    local_28 = def_char_to_monclass(c);
  }
  if (local_28 != 0x3d) {
    for (local_20 = 0; local_20 < 0x193; local_20 = local_20 + 1) {
      if (((local_28 == 0) || (local_28 == mons[local_20].mlet)) &&
         (iVar1 = strcmp(s,mons[local_20].mname), iVar1 == 0)) {
        return local_20;
      }
    }
    for (local_20 = 0; local_20 < 0x193; local_20 = local_20 + 1) {
      if (((local_28 == 0) || (local_28 == mons[local_20].mlet)) &&
         (iVar1 = strcasecmp(s,mons[local_20].mname), iVar1 == 0)) {
        if (be_verbose != 0) {
          lc_warning("Monster type \"%s\" matches \"%s\".",s,mons[local_20].mname);
        }
        return local_20;
      }
    }
  }
  return -1;
}

Assistant:

int get_monster_id(char *s, char c)
{
	int i, class;

	class = c ? def_char_to_monclass(c) : 0;
	if (class == MAXMCLASSES) return ERR;

	for (i = LOW_PM; i < NUMMONS; i++)
	    if (!class || class == mons[i].mlet)
		if (!strcmp(s, mons[i].mname)) return i;
	/* didn't find it; lets try case insensitive search */
	for (i = LOW_PM; i < NUMMONS; i++) {
	    if (!class || class == mons[i].mlet) {
		if (!strcasecmp(s, mons[i].mname)) {
		    if (be_verbose)
			lc_warning("Monster type \"%s\" matches \"%s\".",
				   s, mons[i].mname);
		    return i;
		}
	    }
	}
	return ERR;
}